

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall Scene::create_descriptors(Scene *this,shared_ptr<myvk::Device> *device)

{
  initializer_list<VkDescriptorSetLayoutBinding> __l;
  initializer_list<VkDescriptorPoolSize> __l_00;
  bool bVar1;
  size_type sVar2;
  uint *puVar3;
  Ptr<Device> *device_00;
  Ptr<Device> *pPVar4;
  element_type *this_00;
  reference ppVVar5;
  ulong uVar6;
  reference pvVar7;
  element_type *this_01;
  VkImageView pVVar8;
  element_type *this_02;
  VkDescriptorSet this_03;
  element_type *this_04;
  VkDevice pVVar9;
  iterator in_RSI;
  long in_RDI;
  VkWriteDescriptorSet write;
  uint32_t i_1;
  vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_> image_infos;
  uint32_t i;
  vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_> immutable_samplers;
  VkDescriptorSetLayoutBinding layout_binding;
  shared_ptr<myvk::DescriptorPool> *in_stack_fffffffffffffd68;
  DescriptorBindingFlagGroup *in_stack_fffffffffffffd70;
  PFN_vkUpdateDescriptorSets p_Var10;
  allocator_type *in_stack_fffffffffffffd80;
  size_type in_stack_fffffffffffffd88;
  vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_> *in_stack_fffffffffffffd90;
  allocator_type *in_stack_fffffffffffffd98;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *in_stack_fffffffffffffda0;
  iterator in_stack_fffffffffffffda8;
  size_type in_stack_fffffffffffffdb0;
  allocator<VkDescriptorPoolSize> *paVar11;
  DescriptorBindingFlagGroup *in_stack_fffffffffffffdd0;
  VkSampler in_stack_fffffffffffffde0;
  undefined8 local_1f8;
  void *pvStack_1f0;
  VkDescriptorSet local_1e8;
  DescriptorBindingFlagGroup *in_stack_fffffffffffffe20;
  Ptr<DescriptorPool> *in_stack_fffffffffffffe28;
  uint local_1b8;
  allocator<VkDescriptorImageInfo> local_1b1;
  vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_> local_1b0;
  allocator<VkDescriptorPoolSize> local_181;
  uint local_180;
  uint local_17c [3];
  uint *local_170;
  undefined8 local_168;
  VkDescriptorBindingFlagBits local_134;
  pair<VkDescriptorSetLayoutBinding,_unsigned_int> local_130;
  pair<VkDescriptorSetLayoutBinding,_unsigned_int> *local_110;
  undefined8 local_108;
  initializer_list<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_> local_100 [4];
  allocator<VkDescriptorSetLayoutBinding> local_b9;
  undefined8 local_b8;
  undefined8 uStack_b0;
  VkSampler_T **local_a8;
  undefined8 *local_98;
  undefined8 local_90;
  uint local_60;
  allocator<VkSampler_T_*> local_49;
  vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_> local_48;
  uint local_30;
  uint local_2c;
  VkDescriptorSetLayoutBinding local_28;
  iterator local_10;
  
  local_10 = in_RSI;
  memset(&local_28,0,0x18);
  local_28.binding = 0;
  local_28.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  sVar2 = std::vector<Scene::Texture,_std::allocator<Scene::Texture>_>::size
                    ((vector<Scene::Texture,_std::allocator<Scene::Texture>_> *)(in_RDI + 0x10));
  local_2c = (uint)sVar2;
  local_30 = 1;
  puVar3 = std::max<unsigned_int>(&local_2c,&local_30);
  local_28.descriptorCount = *puVar3;
  local_28.stageFlags = 0x10;
  bVar1 = std::vector<Scene::Texture,_std::allocator<Scene::Texture>_>::empty
                    ((vector<Scene::Texture,_std::allocator<Scene::Texture>_> *)
                     in_stack_fffffffffffffd80);
  if (bVar1) {
    local_134 = VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT;
    std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>::
    pair<VkDescriptorSetLayoutBinding_&,_VkDescriptorBindingFlagBits,_true>
              (&local_130,&local_28,&local_134);
    local_108 = 1;
    local_110 = &local_130;
    myvk::DescriptorBindingFlagGroup::DescriptorBindingFlagGroup
              (in_stack_fffffffffffffdd0,local_100);
    myvk::DescriptorSetLayout::Create
              ((Ptr<Device> *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::shared_ptr<myvk::DescriptorSetLayout>::operator=
              ((shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffffd70,
               (shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffffd68);
    std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
              ((shared_ptr<myvk::DescriptorSetLayout> *)0x138972);
    myvk::DescriptorBindingFlagGroup::~DescriptorBindingFlagGroup(in_stack_fffffffffffffd70);
  }
  else {
    std::vector<Scene::Texture,_std::allocator<Scene::Texture>_>::size
              ((vector<Scene::Texture,_std::allocator<Scene::Texture>_> *)(in_RDI + 0x10));
    std::allocator<VkSampler_T_*>::allocator((allocator<VkSampler_T_*> *)0x138674);
    std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::vector
              ((vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_> *)in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88,(allocator_type *)in_stack_fffffffffffffd80);
    std::allocator<VkSampler_T_*>::~allocator(&local_49);
    local_60 = 0;
    while( true ) {
      device_00 = (Ptr<Device> *)(ulong)local_60;
      pPVar4 = (Ptr<Device> *)
               std::vector<Scene::Texture,_std::allocator<Scene::Texture>_>::size
                         ((vector<Scene::Texture,_std::allocator<Scene::Texture>_> *)(in_RDI + 0x10)
                         );
      if (pPVar4 <= device_00) break;
      this_00 = std::__shared_ptr_access<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1386ec);
      in_stack_fffffffffffffde0 = myvk::Sampler::GetHandle(this_00);
      ppVVar5 = std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::operator[]
                          (&local_48,(ulong)local_60);
      *ppVVar5 = in_stack_fffffffffffffde0;
      local_60 = local_60 + 1;
    }
    local_a8 = std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::data
                         ((vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_> *)0x13877b);
    local_b8 = CONCAT44(local_28.descriptorType,local_28.binding);
    uStack_b0 = CONCAT44(local_28.stageFlags,local_28.descriptorCount);
    local_98 = &local_b8;
    local_90 = 1;
    local_28.pImmutableSamplers = local_a8;
    std::allocator<VkDescriptorSetLayoutBinding>::allocator
              ((allocator<VkDescriptorSetLayoutBinding> *)0x1387de);
    __l._M_len = in_stack_fffffffffffffdb0;
    __l._M_array = in_stack_fffffffffffffda8;
    std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
              ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                *)in_stack_fffffffffffffda0,__l,(allocator_type *)in_stack_fffffffffffffd98);
    myvk::DescriptorSetLayout::Create
              (device_00,
               (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                *)in_stack_fffffffffffffde0);
    std::shared_ptr<myvk::DescriptorSetLayout>::operator=
              ((shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffffd70,
               (shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffffd68);
    std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
              ((shared_ptr<myvk::DescriptorSetLayout> *)0x138844);
    std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::
    ~vector((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
            in_stack_fffffffffffffd80);
    std::allocator<VkDescriptorSetLayoutBinding>::~allocator(&local_b9);
    std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::~vector
              ((vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_> *)in_stack_fffffffffffffd80);
  }
  local_17c[1] = 1;
  sVar2 = std::vector<Scene::Texture,_std::allocator<Scene::Texture>_>::size
                    ((vector<Scene::Texture,_std::allocator<Scene::Texture>_> *)(in_RDI + 0x10));
  local_17c[0] = (uint)sVar2;
  local_180 = 1;
  puVar3 = std::max<unsigned_int>(local_17c,&local_180);
  local_17c[2] = *puVar3;
  local_170 = local_17c + 1;
  local_168 = 1;
  paVar11 = &local_181;
  std::allocator<VkDescriptorPoolSize>::allocator((allocator<VkDescriptorPoolSize> *)0x138a2e);
  __l_00._M_len = (size_type)paVar11;
  __l_00._M_array = local_10;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            (in_stack_fffffffffffffda0,__l_00,in_stack_fffffffffffffd98);
  myvk::DescriptorPool::Create
            ((Ptr<Device> *)local_10,(uint32_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             in_stack_fffffffffffffd98);
  std::shared_ptr<myvk::DescriptorPool>::operator=
            ((shared_ptr<myvk::DescriptorPool> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68
            );
  std::shared_ptr<myvk::DescriptorPool>::~shared_ptr((shared_ptr<myvk::DescriptorPool> *)0x138a99);
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             in_stack_fffffffffffffd80);
  std::allocator<VkDescriptorPoolSize>::~allocator(&local_181);
  myvk::DescriptorSet::Create
            (in_stack_fffffffffffffe28,(Ptr<DescriptorSetLayout> *)in_stack_fffffffffffffe20);
  std::shared_ptr<myvk::DescriptorSet>::operator=
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffd70,
             (shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffd68);
  std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x138af9);
  bVar1 = std::vector<Scene::Texture,_std::allocator<Scene::Texture>_>::empty
                    ((vector<Scene::Texture,_std::allocator<Scene::Texture>_> *)
                     in_stack_fffffffffffffd80);
  if (!bVar1) {
    std::vector<Scene::Texture,_std::allocator<Scene::Texture>_>::size
              ((vector<Scene::Texture,_std::allocator<Scene::Texture>_> *)(in_RDI + 0x10));
    std::allocator<VkDescriptorImageInfo>::allocator((allocator<VkDescriptorImageInfo> *)0x138b3a);
    std::vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>::vector
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::allocator<VkDescriptorImageInfo>::~allocator(&local_1b1);
    local_1b8 = 0;
    while( true ) {
      uVar6 = (ulong)local_1b8;
      sVar2 = std::vector<Scene::Texture,_std::allocator<Scene::Texture>_>::size
                        ((vector<Scene::Texture,_std::allocator<Scene::Texture>_> *)(in_RDI + 0x10))
      ;
      if (sVar2 <= uVar6) break;
      pvVar7 = std::vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>::
               operator[](&local_1b0,(ulong)local_1b8);
      pvVar7->imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
      std::vector<Scene::Texture,_std::allocator<Scene::Texture>_>::operator[]
                ((vector<Scene::Texture,_std::allocator<Scene::Texture>_> *)(in_RDI + 0x10),
                 (ulong)local_1b8);
      this_01 = std::__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x138bdc);
      pVVar8 = myvk::ImageView::GetHandle(this_01);
      pvVar7 = std::vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>::
               operator[](&local_1b0,(ulong)local_1b8);
      pvVar7->imageView = pVVar8;
      local_1b8 = local_1b8 + 1;
    }
    local_1e8 = (VkDescriptorSet)0x0;
    pvStack_1f0 = (void *)0x0;
    local_1f8._0_4_ = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
    local_1f8._4_4_ = 0;
    this_02 = std::
              __shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x138cf4);
    this_03 = myvk::DescriptorSet::GetHandle(this_02);
    local_1e8 = this_03;
    std::vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>::size(&local_1b0);
    std::vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>::data
              ((vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_> *)0x138d52);
    p_Var10 = vkUpdateDescriptorSets;
    this_04 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x138d76);
    pVVar9 = myvk::Device::GetHandle(this_04);
    (*p_Var10)(pVVar9,1,(VkWriteDescriptorSet *)&local_1f8,0,(VkCopyDescriptorSet *)0x0);
    std::vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_>::~vector
              ((vector<VkDescriptorImageInfo,_std::allocator<VkDescriptorImageInfo>_> *)this_03);
  }
  return;
}

Assistant:

void Scene::create_descriptors(const std::shared_ptr<myvk::Device> &device) {
	{
		VkDescriptorSetLayoutBinding layout_binding = {};
		layout_binding.binding = 0;
		layout_binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		layout_binding.descriptorCount = std::max((uint32_t)m_textures.size(), 1u);
		layout_binding.stageFlags = VK_SHADER_STAGE_FRAGMENT_BIT;

		if (!m_textures.empty()) {
			std::vector<VkSampler> immutable_samplers(m_textures.size());
			for (uint32_t i = 0; i < m_textures.size(); ++i)
				immutable_samplers[i] = m_sampler->GetHandle();
			layout_binding.pImmutableSamplers = immutable_samplers.data();
			m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(device, {layout_binding});
		} else {
			m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(
			    device, {{layout_binding, VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT}});
		}
	}
	m_descriptor_pool = myvk::DescriptorPool::Create(
	    device, 1, {{VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, std::max((uint32_t)m_textures.size(), 1u)}});
	m_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_descriptor_set_layout);

	if (!m_textures.empty()) {
		std::vector<VkDescriptorImageInfo> image_infos(m_textures.size());
		for (uint32_t i = 0; i < m_textures.size(); ++i) {
			image_infos[i].imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
			image_infos[i].imageView = m_textures[i].m_image_view->GetHandle();
			// image_infos[i].sampler = m_sampler->GetHandle(); // No need for immutable samplers
		}

		VkWriteDescriptorSet write = {};
		write.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
		write.dstSet = m_descriptor_set->GetHandle();
		write.dstBinding = 0;
		write.dstArrayElement = 0;
		write.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		write.descriptorCount = image_infos.size();
		write.pImageInfo = image_infos.data();

		vkUpdateDescriptorSets(device->GetHandle(), 1, &write, 0, nullptr);
	}
}